

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXRefYs<float>,_ImPlot::GetterXRefYs<float>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXRefYs<float>,_ImPlot::GetterXRefYs<float>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterXRefYs<float> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  int iVar15;
  ImDrawIdx IVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pIVar13 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar15 = pGVar6->Count;
  fVar22 = *(float *)((long)pGVar6->Ys +
                     (long)(((pGVar6->Offset + prim) % iVar15 + iVar15) % iVar15) *
                     (long)pGVar6->Stride);
  dVar18 = log10(pGVar6->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar14 = GImPlot;
  pIVar8 = pIVar13->CurrentPlot;
  dVar1 = (pIVar8->XAxis).Range.Min;
  iVar15 = pTVar7->YAxis;
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar3 = pGVar6->Count;
  fVar19 = *(float *)((long)pGVar6->Ys +
                     (long)(((prim + pGVar6->Offset) % iVar3 + iVar3) % iVar3) *
                     (long)pGVar6->Stride);
  IVar2 = pIVar13->PixelRange[iVar15].Min;
  fVar20 = (float)(pIVar13->My[iVar15] * ((double)fVar22 - pIVar8->YAxis[iVar15].Range.Min) +
                  (double)IVar2.y);
  fVar21 = (float)(pIVar13->Mx *
                   (((double)(float)(dVar18 / pIVar13->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.x);
  dVar18 = log10(pGVar6->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar14->CurrentPlot;
  dVar1 = (pIVar8->XAxis).Range.Min;
  iVar15 = pTVar7->YAxis;
  IVar2 = pIVar14->PixelRange[iVar15].Min;
  fVar17 = (float)(pIVar14->Mx *
                   (((double)(float)(dVar18 / pIVar14->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.x);
  fVar19 = (float)(pIVar14->My[iVar15] * ((double)fVar19 - pIVar8->YAxis[iVar15].Range.Min) +
                  (double)IVar2.y);
  auVar25._0_4_ = ~-(uint)(fVar17 <= fVar21) & (uint)fVar17;
  auVar25._4_4_ = ~-(uint)(fVar19 <= fVar20) & (uint)fVar19;
  auVar25._8_4_ = ~-(uint)(fVar21 < fVar17) & (uint)fVar17;
  auVar25._12_4_ = ~-(uint)(fVar20 < fVar19) & (uint)fVar19;
  auVar11._4_4_ = (uint)fVar20 & -(uint)(fVar19 <= fVar20);
  auVar11._0_4_ = (uint)fVar21 & -(uint)(fVar17 <= fVar21);
  auVar11._8_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar17);
  auVar11._12_4_ = (uint)fVar20 & -(uint)(fVar20 < fVar19);
  auVar25 = auVar25 | auVar11;
  fVar22 = (cull_rect->Min).y;
  auVar27._4_4_ = -(uint)(fVar22 < auVar25._4_4_);
  auVar27._0_4_ = -(uint)((cull_rect->Min).x < auVar25._0_4_);
  auVar12._4_8_ = auVar25._8_8_;
  auVar12._0_4_ = -(uint)(auVar25._4_4_ < fVar22);
  auVar26._0_8_ = auVar12._0_8_ << 0x20;
  auVar26._8_4_ = -(uint)(auVar25._8_4_ < (cull_rect->Max).x);
  auVar26._12_4_ = -(uint)(auVar25._12_4_ < (cull_rect->Max).y);
  auVar27._8_8_ = auVar26._8_8_;
  iVar15 = movmskps((int)cull_rect,auVar27);
  if (iVar15 == 0xf) {
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar22 = fVar17 - fVar21;
    fVar23 = fVar19 - fVar20;
    fVar24 = fVar22 * fVar22 + fVar23 * fVar23;
    if (0.0 < fVar24) {
      fVar24 = 1.0 / SQRT(fVar24);
      fVar22 = fVar22 * fVar24;
      fVar23 = fVar23 * fVar24;
    }
    fVar24 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    fVar22 = fVar24 * fVar22;
    fVar24 = fVar24 * fVar23;
    (pIVar9->pos).x = fVar24 + fVar21;
    (pIVar9->pos).y = fVar20 - fVar22;
    (pIVar9->uv).x = IVar2.x;
    (pIVar9->uv).y = IVar2.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar4;
    pIVar9[1].pos.x = fVar24 + fVar17;
    pIVar9[1].pos.y = fVar19 - fVar22;
    pIVar9[1].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = fVar17 - fVar24;
    pIVar9[2].pos.y = fVar19 + fVar22;
    pIVar9[2].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    pIVar9[3].pos.x = fVar21 - fVar24;
    pIVar9[3].pos.y = fVar22 + fVar20;
    pIVar9[3].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar5;
    *pIVar10 = IVar16;
    pIVar10[1] = IVar16 + 1;
    pIVar10[2] = IVar16 + 2;
    pIVar10[3] = IVar16;
    pIVar10[4] = IVar16 + 2;
    pIVar10[5] = IVar16 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  return (char)iVar15 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }